

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::ParseFormatPrecision(char *fmt,int default_precision)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int precision;
  int default_precision_local;
  char *fmt_local;
  
  _precision = fmt;
  while( true ) {
    pcVar3 = strchr(_precision,0x25);
    if (pcVar3 == (char *)0x0) {
      return default_precision;
    }
    _precision = pcVar3 + 1;
    if (*_precision != '%') break;
    _precision = pcVar3 + 2;
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *_precision) {
      bVar1 = *_precision < ':';
    }
    if (!bVar1) break;
    _precision = _precision + 1;
  }
  if (*_precision != '.') {
    return default_precision;
  }
  iVar2 = atoi(_precision + 1);
  if ((-1 < iVar2) && (iVar2 < 0xb)) {
    return iVar2;
  }
  return default_precision;
}

Assistant:

int ImGui::ParseFormatPrecision(const char* fmt, int default_precision)
{
    int precision = default_precision;
    while ((fmt = strchr(fmt, '%')) != NULL)
    {
        fmt++;
        if (fmt[0] == '%') { fmt++; continue; } // Ignore "%%"
        while (*fmt >= '0' && *fmt <= '9')
            fmt++;
        if (*fmt == '.')
        {
            precision = atoi(fmt + 1);
            if (precision < 0 || precision > 10)
                precision = default_precision;
        }
        break;
    }
    return precision;
}